

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O1

strpool_internal_entry_t * strpool_internal_get_entry(strpool_t *pool,unsigned_long_long handle)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)pool->index_mask & (uint)handle;
  if ((0 < (int)uVar1) && ((int)uVar1 <= pool->handle_count)) {
    uVar2 = (uint)pool->counter_mask;
    if ((uVar2 & pool->handles[uVar1 - 1].counter) ==
        ((uint)(handle >> ((byte)pool->counter_shift & 0x3f)) & uVar2)) {
      return pool->entries + pool->handles[uVar1 - 1].entry_index;
    }
  }
  return (strpool_internal_entry_t *)0x0;
}

Assistant:

static strpool_internal_entry_t* strpool_internal_get_entry( strpool_t const* pool, STRPOOL_U64 handle )
    {
    int index = strpool_internal_index_from_handle( handle, pool->index_mask );
    int counter = strpool_internal_counter_from_handle( handle, pool->counter_shift, pool->counter_mask );

    if( index >= 0 && index < pool->handle_count && 
        counter == (int) ( pool->handles[ index ].counter & pool->counter_mask ) )
            return &pool->entries[ pool->handles[ index ].entry_index ];

    return 0;
    }